

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_vsendf(Curl_easy *data,pingpong *pp,char *fmt,__va_list_tag *args)

{
  dynbuf *s;
  CURLcode CVar1;
  size_t blen;
  char *ptr;
  curltime cVar2;
  size_t bytes_written;
  size_t local_30;
  
  local_30 = 0;
  if (data->conn == (connectdata *)0x0) {
    CVar1 = CURLE_SEND_ERROR;
  }
  else {
    s = &pp->sendbuf;
    Curl_dyn_reset(s);
    CVar1 = Curl_dyn_vaddf(s,fmt,args);
    if ((CVar1 == CURLE_OK) && (CVar1 = Curl_dyn_addn(s,"\r\n",2), CVar1 == CURLE_OK)) {
      pp->pending_resp = true;
      blen = Curl_dyn_len(s);
      ptr = Curl_dyn_ptr(s);
      CVar1 = Curl_conn_send(data,0,ptr,blen,false,&local_30);
      if (CVar1 != CURLE_OK) {
        if (CVar1 != CURLE_AGAIN) {
          return CVar1;
        }
        local_30 = 0;
      }
      Curl_debug(data,CURLINFO_HEADER_OUT,ptr,local_30);
      if (blen - local_30 == 0) {
        pp->sendthis = (char *)0x0;
        pp->sendleft = 0;
        pp->sendsize = 0;
        cVar2 = Curl_now();
        (pp->response).tv_sec = cVar2.tv_sec;
        (pp->response).tv_usec = cVar2.tv_usec;
      }
      else {
        pp->sendthis = ptr;
        pp->sendsize = blen;
        pp->sendleft = blen - local_30;
      }
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_pp_vsendf(struct Curl_easy *data,
                        struct pingpong *pp,
                        const char *fmt,
                        va_list args)
{
  size_t bytes_written = 0;
  size_t write_len;
  char *s;
  CURLcode result;
  struct connectdata *conn = data->conn;

#ifdef HAVE_GSSAPI
  enum protection_level data_sec;
#endif

  DEBUGASSERT(pp->sendleft == 0);
  DEBUGASSERT(pp->sendsize == 0);
  DEBUGASSERT(pp->sendthis == NULL);

  if(!conn)
    /* cannot send without a connection! */
    return CURLE_SEND_ERROR;

  Curl_dyn_reset(&pp->sendbuf);
  result = Curl_dyn_vaddf(&pp->sendbuf, fmt, args);
  if(result)
    return result;

  /* append CRLF */
  result = Curl_dyn_addn(&pp->sendbuf, "\r\n", 2);
  if(result)
    return result;

  pp->pending_resp = TRUE;
  write_len = Curl_dyn_len(&pp->sendbuf);
  s = Curl_dyn_ptr(&pp->sendbuf);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CMD;
#endif
  result = Curl_conn_send(data, FIRSTSOCKET, s, write_len, FALSE,
                          &bytes_written);
  if(result == CURLE_AGAIN) {
    bytes_written = 0;
  }
  else if(result)
    return result;
#ifdef HAVE_GSSAPI
  data_sec = conn->data_prot;
  DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
  conn->data_prot = (unsigned char)data_sec;
#endif

  Curl_debug(data, CURLINFO_HEADER_OUT, s, bytes_written);

  if(bytes_written != write_len) {
    /* the whole chunk was not sent, keep it around and adjust sizes */
    pp->sendthis = s;
    pp->sendsize = write_len;
    pp->sendleft = write_len - bytes_written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }

  return CURLE_OK;
}